

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_bf16_to_fp32_row(ggml_bf16_t *x,float *y,int64_t n)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar1;
  int64_t i;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    fVar1 = ggml_compute_bf16_to_fp32((ggml_bf16_t)*(uint16_t *)(in_RDI + local_20 * 2));
    *(float *)(in_RSI + local_20 * 4) = fVar1;
  }
  return;
}

Assistant:

void ggml_bf16_to_fp32_row(const ggml_bf16_t * x, float * y, int64_t n) {
    int64_t i = 0;
#if defined(__AVX512F__)
    //if (ggml_cpu_has_avx512()) {
        for (; i + 16 <= n; i += 16) {
            _mm512_storeu_ps(y + i,
                            _mm512_castsi512_ps(
                                _mm512_slli_epi32(
                                    _mm512_cvtepu16_epi32(
                                        _mm256_loadu_si256(
                                            (const __m256i *)(x + i))),
                                    16)));
        }
    //}
#endif
#if defined(__AVX2__)
    //if (ggml_cpu_has_avx2()) {
        for (; i + 8 <= n; i += 8) {
            _mm256_storeu_ps(y + i,
                            _mm256_castsi256_ps(
                                _mm256_slli_epi32(
                                    _mm256_cvtepu16_epi32(
                                        _mm_loadu_si128(
                                            (const __m128i *)(x + i))),
                                    16)));
        }
    //}
#endif
    for (; i < n; i++) {
        y[i] = GGML_BF16_TO_FP32(x[i]);
    }
}